

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_cache_test.cc
# Opt level: O0

void TemplateCacheUnittest::TestTemplateCache(void)

{
  TemplateString local_238;
  TemplateString local_218;
  TemplateString local_1f8;
  TemplateString local_1d8;
  TemplateString local_1b8;
  TemplateString local_198;
  TemplateString local_178;
  TemplateString local_158;
  TemplateString local_138;
  TemplateString local_118;
  Template *local_f8;
  Template *tpl2;
  Template *tpl;
  TemplateCache cache1;
  allocator local_a1;
  string local_a0 [32];
  ctemplate local_80 [8];
  string filename_b;
  allocator local_49;
  string local_48 [32];
  ctemplate local_28 [8];
  string filename_a;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_48,"Test template 1",&local_49);
  ctemplate::StringToTemplateFile(local_28,(string *)local_48);
  std::__cxx11::string::~string(local_48);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_a0,"Test template 2.",&local_a1);
  ctemplate::StringToTemplateFile(local_80,(string *)local_a0);
  std::__cxx11::string::~string(local_a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_a1);
  ctemplate::TemplateCache::TemplateCache((TemplateCache *)&tpl);
  ctemplate::TemplateString::TemplateString(&local_118,(string *)local_28);
  tpl2 = (Template *)ctemplate::TemplateCache::GetTemplate((TemplateString *)&tpl,(Strip)&local_118)
  ;
  if (tpl2 == (Template *)0x0) {
    printf("ASSERT FAILED, line %d: %s\n",0x17d,"tpl = cache1.GetTemplate(filename_a, DO_NOT_STRIP)"
          );
    ctemplate::TemplateString::TemplateString(&local_138,(string *)local_28);
    tpl2 = (Template *)
           ctemplate::TemplateCache::GetTemplate((TemplateString *)&tpl,(Strip)&local_138);
    if (tpl2 != (Template *)0x0) {
      exit(1);
    }
    __assert_fail("tpl = cache1.GetTemplate(filename_a, DO_NOT_STRIP)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_cache_test.cc"
                  ,0x17d,"static void TemplateCacheUnittest::TestTemplateCache()");
  }
  ctemplate::TemplateString::TemplateString(&local_158,(string *)local_80);
  local_f8 = (Template *)
             ctemplate::TemplateCache::GetTemplate((TemplateString *)&tpl,(Strip)&local_158);
  if (local_f8 == (Template *)0x0) {
    printf("ASSERT FAILED, line %d: %s\n",0x17f,
           "tpl2 = cache1.GetTemplate(filename_b, DO_NOT_STRIP)");
    ctemplate::TemplateString::TemplateString(&local_178,(string *)local_80);
    local_f8 = (Template *)
               ctemplate::TemplateCache::GetTemplate((TemplateString *)&tpl,(Strip)&local_178);
    if (local_f8 != (Template *)0x0) {
      exit(1);
    }
    __assert_fail("tpl2 = cache1.GetTemplate(filename_b, DO_NOT_STRIP)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_cache_test.cc"
                  ,0x17f,"static void TemplateCacheUnittest::TestTemplateCache()");
  }
  if (local_f8 == tpl2) {
    printf("ASSERT FAILED, line %d: %s\n",0x180,"tpl2 != tpl");
    if (local_f8 != tpl2) {
      exit(1);
    }
    __assert_fail("tpl2 != tpl",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_cache_test.cc"
                  ,0x180,"static void TemplateCacheUnittest::TestTemplateCache()");
  }
  ctemplate::TemplateString::TemplateString(&local_198,(string *)local_28);
  local_f8 = (Template *)
             ctemplate::TemplateCache::GetTemplate((TemplateString *)&tpl,(Strip)&local_198);
  if (local_f8 == (Template *)0x0) {
    printf("ASSERT FAILED, line %d: %s\n",0x181,
           "tpl2 = cache1.GetTemplate(filename_a, STRIP_BLANK_LINES)");
    ctemplate::TemplateString::TemplateString(&local_1b8,(string *)local_28);
    local_f8 = (Template *)
               ctemplate::TemplateCache::GetTemplate((TemplateString *)&tpl,(Strip)&local_1b8);
    if (local_f8 != (Template *)0x0) {
      exit(1);
    }
    __assert_fail("tpl2 = cache1.GetTemplate(filename_a, STRIP_BLANK_LINES)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_cache_test.cc"
                  ,0x181,"static void TemplateCacheUnittest::TestTemplateCache()");
  }
  if (local_f8 == tpl2) {
    printf("ASSERT FAILED, line %d: %s\n",0x182,"tpl2 != tpl");
    if (local_f8 != tpl2) {
      exit(1);
    }
    __assert_fail("tpl2 != tpl",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_cache_test.cc"
                  ,0x182,"static void TemplateCacheUnittest::TestTemplateCache()");
  }
  ctemplate::TemplateString::TemplateString(&local_1d8,(string *)local_80);
  local_f8 = (Template *)
             ctemplate::TemplateCache::GetTemplate((TemplateString *)&tpl,(Strip)&local_1d8);
  if (local_f8 == (Template *)0x0) {
    printf("ASSERT FAILED, line %d: %s\n",0x183,
           "tpl2 = cache1.GetTemplate(filename_b, STRIP_BLANK_LINES)");
    ctemplate::TemplateString::TemplateString(&local_1f8,(string *)local_80);
    local_f8 = (Template *)
               ctemplate::TemplateCache::GetTemplate((TemplateString *)&tpl,(Strip)&local_1f8);
    if (local_f8 != (Template *)0x0) {
      exit(1);
    }
    __assert_fail("tpl2 = cache1.GetTemplate(filename_b, STRIP_BLANK_LINES)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_cache_test.cc"
                  ,0x183,"static void TemplateCacheUnittest::TestTemplateCache()");
  }
  if (local_f8 == tpl2) {
    printf("ASSERT FAILED, line %d: %s\n",0x184,"tpl2 != tpl");
    if (local_f8 != tpl2) {
      exit(1);
    }
    __assert_fail("tpl2 != tpl",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_cache_test.cc"
                  ,0x184,"static void TemplateCacheUnittest::TestTemplateCache()");
  }
  ctemplate::TemplateString::TemplateString(&local_218,(string *)local_28);
  local_f8 = (Template *)
             ctemplate::TemplateCache::GetTemplate((TemplateString *)&tpl,(Strip)&local_218);
  if (local_f8 == (Template *)0x0) {
    printf("ASSERT FAILED, line %d: %s\n",0x185,
           "tpl2 = cache1.GetTemplate(filename_a, DO_NOT_STRIP)");
    ctemplate::TemplateString::TemplateString(&local_238,(string *)local_28);
    local_f8 = (Template *)
               ctemplate::TemplateCache::GetTemplate((TemplateString *)&tpl,(Strip)&local_238);
    if (local_f8 != (Template *)0x0) {
      exit(1);
    }
    __assert_fail("tpl2 = cache1.GetTemplate(filename_a, DO_NOT_STRIP)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_cache_test.cc"
                  ,0x185,"static void TemplateCacheUnittest::TestTemplateCache()");
  }
  if (local_f8 != tpl2) {
    printf("ASSERT FAILED, line %d: %s\n",0x186,"tpl2 == tpl");
    if (local_f8 == tpl2) {
      exit(1);
    }
    __assert_fail("tpl2 == tpl",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_cache_test.cc"
                  ,0x186,"static void TemplateCacheUnittest::TestTemplateCache()");
  }
  ctemplate::TemplateCache::~TemplateCache((TemplateCache *)&tpl);
  std::__cxx11::string::~string((string *)local_80);
  std::__cxx11::string::~string((string *)local_28);
  return;
}

Assistant:

static void TestTemplateCache() {
    const string filename_a = StringToTemplateFile("Test template 1");
    const string filename_b = StringToTemplateFile("Test template 2.");

    TemplateCache cache1;
    const Template *tpl, *tpl2;
    ASSERT(tpl = cache1.GetTemplate(filename_a, DO_NOT_STRIP));

    ASSERT(tpl2 = cache1.GetTemplate(filename_b, DO_NOT_STRIP));
    ASSERT(tpl2 != tpl);  // different filenames.
    ASSERT(tpl2 = cache1.GetTemplate(filename_a, STRIP_BLANK_LINES));
    ASSERT(tpl2 != tpl);  // different strip.
    ASSERT(tpl2 = cache1.GetTemplate(filename_b, STRIP_BLANK_LINES));
    ASSERT(tpl2 != tpl);  // different filenames and strip.
    ASSERT(tpl2 = cache1.GetTemplate(filename_a, DO_NOT_STRIP));
    ASSERT(tpl2 == tpl);  // same filename and strip.
  }